

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O3

bool __thiscall S2Polygon::FindValidationError(S2Polygon *this,S2Error *error)

{
  byte bVar1;
  int iVar2;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> _Var3;
  pointer pcVar4;
  bool bVar5;
  pointer puVar6;
  int iVar7;
  char *format;
  Code CVar8;
  ulong uVar9;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  puVar6 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->loops_).
                              super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6) >> 3)) {
    uVar9 = 0;
    do {
      bVar5 = S2Loop::FindValidationErrorNoIndex
                        ((S2Loop *)
                         puVar6[uVar9]._M_t.
                         super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,error);
      if (bVar5) {
        CVar8 = error->code_;
        pcVar4 = (error->text_)._M_dataplus._M_p;
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,pcVar4,pcVar4 + (error->text_)._M_string_length);
        S2Error::Init(error,CVar8,"Loop %d: %s",uVar9 & 0xffffffff,local_48[0]);
        if (local_48[0] == local_38) {
          return true;
        }
        operator_delete(local_48[0]);
        return true;
      }
      puVar6 = (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var3._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
      super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
           puVar6[uVar9]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
      iVar2 = *(int *)((long)_Var3._M_t.
                             super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                             super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0xc);
      bVar1 = *(byte *)((long)_Var3._M_t.
                              super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                              super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x1a);
      if (iVar2 == 1 && (bVar1 & 1) == 0) {
        format = "Loop %d: empty loops are not allowed";
        CVar8 = POLYGON_EMPTY_LOOP;
LAB_0020687c:
        S2Error::Init(error,CVar8,format,uVar9 & 0xffffffff);
        return true;
      }
      iVar7 = (int)((ulong)((long)(this->loops_).
                                  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6) >> 3);
      if (((iVar2 == 1) && ((bVar1 & 1) != 0)) && (1 < iVar7)) {
        format = "Loop %d: full loop appears in non-full polygon";
        CVar8 = POLYGON_EXCESS_FULL_LOOP;
        goto LAB_0020687c;
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)iVar7);
  }
  bVar5 = s2shapeutil::FindSelfIntersection(&(this->index_).super_S2ShapeIndex,error);
  if (!bVar5) {
    if (this->error_inconsistent_loop_orientations_ == '\0') {
      bVar5 = FindLoopNestingError(this,error);
      return bVar5;
    }
    S2Error::Init(error,POLYGON_INCONSISTENT_LOOP_ORIENTATIONS,
                  "Inconsistent loop orientations detected");
  }
  return true;
}

Assistant:

bool S2Polygon::FindValidationError(S2Error* error) const {
  for (int i = 0; i < num_loops(); ++i) {
    // Check for loop errors that don't require building an S2ShapeIndex.
    if (loop(i)->FindValidationErrorNoIndex(error)) {
      error->Init(error->code(),
                  "Loop %d: %s", i, error->text().c_str());
      return true;
    }
    // Check that no loop is empty, and that the full loop only appears in the
    // full polygon.
    if (loop(i)->is_empty()) {
      error->Init(S2Error::POLYGON_EMPTY_LOOP,
                  "Loop %d: empty loops are not allowed", i);
      return true;
    }
    if (loop(i)->is_full() && num_loops() > 1) {
      error->Init(S2Error::POLYGON_EXCESS_FULL_LOOP,
                  "Loop %d: full loop appears in non-full polygon", i);
      return true;
    }
  }

  // Check for loop self-intersections and loop pairs that cross
  // (including duplicate edges and vertices).
  if (s2shapeutil::FindSelfIntersection(index_, error)) return true;

  // Check whether InitOriented detected inconsistent loop orientations.
  if (error_inconsistent_loop_orientations_) {
    error->Init(S2Error::POLYGON_INCONSISTENT_LOOP_ORIENTATIONS,
                "Inconsistent loop orientations detected");
    return true;
  }

  // Finally, verify the loop nesting hierarchy.
  return FindLoopNestingError(error);
}